

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O2

bool __thiscall tinyusdz::Stage::compute_absolute_prim_path(Stage *this)

{
  Prim *pPVar1;
  Prim *pPVar2;
  bool bVar3;
  Prim *prim;
  Prim *root;
  allocator local_142;
  allocator local_141;
  string local_140;
  string local_120;
  Path rootPath;
  
  std::__cxx11::string::string((string *)&local_120,"/",&local_141);
  std::__cxx11::string::string((string *)&local_140,"",&local_142);
  Path::Path(&rootPath,&local_120,&local_140);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  pPVar1 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pPVar2 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    prim = pPVar2;
    if (prim == pPVar1) break;
    bVar3 = anon_unknown_28::ComputeAbsPathAndAssignPrimIdRec
                      (this,prim,&rootPath,1,false,true,&this->_err);
    pPVar2 = prim + 1;
  } while (bVar3);
  Path::~Path(&rootPath);
  return prim == pPVar1;
}

Assistant:

bool Stage::compute_absolute_prim_path() {
  Path rootPath("/", "");
  for (Prim &root : root_prims()) {
    if (!ComputeAbsPathAndAssignPrimIdRec(
            *this, root, rootPath, 1, /* assign prim_id */ false,
            /* force_assign_prim_id */ true, &_err)) {
      return false;
    }
  }

  return true;
}